

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::delete_edge
          (PolyConnectivity *this,EdgeHandle _eh,bool _delete_isolated_vertices)

{
  HalfedgeHandle _heh;
  FaceHandle _fh;
  FaceHandle _fh_00;
  StatusInfo *pSVar1;
  
  _fh = ArrayKernel::face_handle
                  (&this->super_ArrayKernel,(HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2));
  _heh.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  _fh_00 = ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
  if (_fh.super_BaseHandle.idx_ == -1) {
    if (_fh_00.super_BaseHandle.idx_ != -1) goto LAB_001acd9d;
    if ((this->super_ArrayKernel).edge_status_.
        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_ != -1) {
      pSVar1 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
      *(byte *)&pSVar1->status_ = (byte)pSVar1->status_ | 1;
    }
    if ((this->super_ArrayKernel).halfedge_status_.
        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_ != -1) {
      pSVar1 = ArrayKernel::status(&this->super_ArrayKernel,
                                   (HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2));
      *(byte *)&pSVar1->status_ = (byte)pSVar1->status_ | 1;
      pSVar1 = ArrayKernel::status(&this->super_ArrayKernel,_heh);
      *(byte *)&pSVar1->status_ = (byte)pSVar1->status_ | 1;
    }
  }
  else {
    delete_face(this,_fh,_delete_isolated_vertices);
    if (_fh_00.super_BaseHandle.idx_ != -1) {
LAB_001acd9d:
      delete_face(this,_fh_00,_delete_isolated_vertices);
      return;
    }
  }
  return;
}

Assistant:

void PolyConnectivity::delete_edge(EdgeHandle _eh, bool _delete_isolated_vertices)
{
  FaceHandle fh0(face_handle(halfedge_handle(_eh, 0)));
  FaceHandle fh1(face_handle(halfedge_handle(_eh, 1)));

  if (fh0.is_valid())  delete_face(fh0, _delete_isolated_vertices);
  if (fh1.is_valid())  delete_face(fh1, _delete_isolated_vertices);

  // If there is no face, we delete the edge
  // here
  if ( ! fh0.is_valid() && !fh1.is_valid()) {
    // mark edge deleted if the mesh has a edge status
    if ( has_edge_status() )
      status(_eh).set_deleted(true);

    // mark corresponding halfedges as deleted
    // As the deleted edge is boundary,
    // all corresponding halfedges will also be deleted.
    if ( has_halfedge_status() ) {
      status(halfedge_handle(_eh, 0)).set_deleted(true);
      status(halfedge_handle(_eh, 1)).set_deleted(true);
    }
  }
}